

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O0

void handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>
               (request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
                *req,send_lambda *send)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  string_view target_00;
  string_view why;
  string_view why_00;
  string_view why_01;
  bool bVar1;
  int iVar2;
  reference_type puVar3;
  reference pvVar4;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_> *in_RDI;
  optional<unsigned_long> oVar5;
  __sv_type _Var6;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  *in_stack_00000048;
  string *in_stack_00000050;
  RestCommand in_stack_0000005c;
  undefined1 in_stack_00000060 [16];
  string_view in_stack_00000080;
  pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  res;
  string targetObj;
  string query;
  string brokerName;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
  reqpr;
  optional<unsigned_long> psize;
  string_view target;
  verb method;
  RestCommand command;
  anon_class_8_1_ba1d73fe response_ok;
  anon_class_8_1_ba1d73fe not_found;
  anon_class_8_1_ba1d73fe bad_request;
  char *in_stack_fffffffffffff7b8;
  message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  *in_stack_fffffffffffff7c0;
  message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  *pmVar7;
  char *in_stack_fffffffffffff7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7d0;
  size_t in_stack_fffffffffffff7d8;
  char *in_stack_fffffffffffff7e0;
  size_t in_stack_fffffffffffff7e8;
  allocator<char> *in_stack_fffffffffffff7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff80c;
  undefined2 in_stack_fffffffffffff810;
  undefined1 in_stack_fffffffffffff812;
  undefined1 in_stack_fffffffffffff813;
  undefined1 in_stack_fffffffffffff814;
  undefined1 in_stack_fffffffffffff815;
  undefined1 in_stack_fffffffffffff816;
  undefined1 in_stack_fffffffffffff817;
  undefined1 *puVar8;
  char *pcVar9;
  message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  *in_stack_fffffffffffff848;
  send_lambda *in_stack_fffffffffffff850;
  anon_class_8_1_ba1d73fe *in_stack_fffffffffffff8f8;
  string *in_stack_fffffffffffff900;
  anon_class_8_1_ba1d73fe *in_stack_fffffffffffff908;
  string_view in_stack_fffffffffffff910;
  string_view in_stack_fffffffffffffb50;
  string_view in_stack_fffffffffffffb60;
  int local_470;
  char local_418 [32];
  undefined1 local_3f8 [32];
  __sv_type local_3d8;
  size_t local_3c8;
  char *pcStack_3c0;
  allocator<char> local_379 [177];
  size_t local_2c8;
  char *local_2c0;
  size_t local_2a8;
  char *local_2a0;
  message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  local_288;
  size_t local_1f8;
  char *local_1f0;
  size_t local_1d8;
  char *local_1d0;
  size_t local_1b8;
  char *local_1b0;
  undefined1 local_1a8;
  unsigned_long local_1a0;
  string_view local_198;
  allocator<char> local_e1 [161];
  verb local_40;
  undefined4 local_3c;
  header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_> *local_38;
  header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_> *local_30;
  header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_> *local_28;
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  if ((handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
       ::index_page_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                                   ::index_page_abi_cxx11_), iVar2 != 0)) {
    generateIndexPage_abi_cxx11_();
    __cxa_atexit(std::__cxx11::string::~string,
                 &handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                  ::index_page_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                         ::index_page_abi_cxx11_);
  }
  local_28 = local_8;
  local_30 = local_8;
  local_38 = local_8;
  local_3c = 0;
  local_40 = boost::beast::http::
             header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>::method(local_8)
  ;
  switch(local_40) {
  case delete_:
    local_3c = 2;
    break;
  case get:
  case head:
  case search:
    break;
  case post:
  case put:
    local_3c = 1;
    break;
  default:
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7d0,
               in_stack_fffffffffffff7c8);
    why._M_str = (char *)in_stack_fffffffffffff908;
    why._M_len = (size_t)in_stack_fffffffffffff900;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(in_stack_fffffffffffff8f8,why);
    HttpSession::send_lambda::operator()((send_lambda *)local_10,in_stack_fffffffffffff848);
    boost::beast::http::
    message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
    ::~message(in_stack_fffffffffffff7c0);
    return;
  case options:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0
              );
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7d0,
               in_stack_fffffffffffff7c8);
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()
              (in_stack_fffffffffffff908,in_stack_fffffffffffff900,in_stack_fffffffffffff910);
    HttpSession::send_lambda::operator()(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
    boost::beast::http::
    message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
    ::~message(in_stack_fffffffffffff7c0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7c0);
    std::allocator<char>::~allocator(local_e1);
    return;
  }
  local_198 = boost::beast::http::
              header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>::target
                        ((header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_> *)
                         0x300807);
  oVar5 = boost::beast::http::
          message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
          ::payload_size((message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                          *)in_stack_fffffffffffff7c0);
  local_1a0 = oVar5.super_type.m_storage;
  local_1a8 = oVar5.super_type.m_initialized;
  local_1b8 = local_198._M_len;
  local_1b0 = local_198._M_str;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7d0,
             in_stack_fffffffffffff7c8);
  __x._M_str = (char *)in_stack_fffffffffffff7f0;
  __x._M_len = in_stack_fffffffffffff7e8;
  __y._M_str = in_stack_fffffffffffff7e0;
  __y._M_len = in_stack_fffffffffffff7d8;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
LAB_0030097f:
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7d0,
               in_stack_fffffffffffff7c8);
    pmVar7 = &local_288;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()
              (in_stack_fffffffffffff908,in_stack_fffffffffffff900,in_stack_fffffffffffff910);
    HttpSession::send_lambda::operator()(in_stack_fffffffffffff850,pmVar7);
    boost::beast::http::
    message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
    ::~message(in_stack_fffffffffffff7c0);
    return;
  }
  local_1d8 = local_198._M_len;
  local_1d0 = local_198._M_str;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7d0,
             in_stack_fffffffffffff7c8);
  __x_00._M_str = (char *)in_stack_fffffffffffff7f0;
  __x_00._M_len = in_stack_fffffffffffff7e8;
  __y_00._M_str = in_stack_fffffffffffff7e0;
  __y_00._M_len = in_stack_fffffffffffff7d8;
  bVar1 = std::operator==(__x_00,__y_00);
  if (bVar1) goto LAB_0030097f;
  local_1f8 = local_198._M_len;
  local_1f0 = local_198._M_str;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7d0,
             in_stack_fffffffffffff7c8);
  __x_01._M_str = (char *)in_stack_fffffffffffff7f0;
  __x_01._M_len = in_stack_fffffffffffff7e8;
  __y_01._M_str = in_stack_fffffffffffff7e0;
  __y_01._M_len = in_stack_fffffffffffff7d8;
  bVar1 = std::operator==(__x_01,__y_01);
  if ((bVar1) &&
     ((bVar1 = boost::optional<unsigned_long>::operator!((optional<unsigned_long> *)0x300964), bVar1
      || (puVar3 = boost::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x300975),
         *puVar3 < 4)))) goto LAB_0030097f;
  local_2a8 = local_198._M_len;
  local_2a0 = local_198._M_str;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7d0,
             in_stack_fffffffffffff7c8);
  __x_02._M_str = (char *)in_stack_fffffffffffff7f0;
  __x_02._M_len = in_stack_fffffffffffff7e8;
  __y_02._M_str = in_stack_fffffffffffff7e0;
  __y_02._M_len = in_stack_fffffffffffff7d8;
  bVar1 = std::operator==(__x_02,__y_02);
  if (bVar1) {
LAB_00300ae5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0
              );
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7d0,
               in_stack_fffffffffffff7c8);
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()
              (in_stack_fffffffffffff908,in_stack_fffffffffffff900,in_stack_fffffffffffff910);
    HttpSession::send_lambda::operator()(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
    boost::beast::http::
    message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
    ::~message(in_stack_fffffffffffff7c0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7c0);
    std::allocator<char>::~allocator(local_379);
    return;
  }
  local_2c8 = local_198._M_len;
  local_2c0 = local_198._M_str;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7d0,
             in_stack_fffffffffffff7c8);
  __x_03._M_str = (char *)in_stack_fffffffffffff7f0;
  __x_03._M_len = in_stack_fffffffffffff7e8;
  __y_03._M_str = in_stack_fffffffffffff7e0;
  __y_03._M_len = in_stack_fffffffffffff7d8;
  bVar1 = std::operator==(__x_03,__y_03);
  if (bVar1) goto LAB_00300ae5;
  local_3c8 = local_198._M_len;
  pcStack_3c0 = local_198._M_str;
  boost::beast::http::
  message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
  ::body_abi_cxx11_((message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                     *)0x300c31);
  local_3d8 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff7c0);
  processRequestParameters_abi_cxx11_(in_stack_fffffffffffffb60,in_stack_fffffffffffffb50);
  puVar8 = local_3f8;
  std::__cxx11::string::string(in_stack_fffffffffffff7d0);
  pcVar9 = local_418;
  std::__cxx11::string::string(in_stack_fffffffffffff7d0);
  std::__cxx11::string::string(in_stack_fffffffffffff7d0);
  target_00._M_str = pcVar9;
  target_00._M_len = (size_t)puVar8;
  partitionTarget(target_00,
                  (string *)
                  CONCAT17(in_stack_fffffffffffff817,
                           CONCAT16(in_stack_fffffffffffff816,
                                    CONCAT15(in_stack_fffffffffffff815,
                                             CONCAT14(in_stack_fffffffffffff814,
                                                      CONCAT13(in_stack_fffffffffffff813,
                                                               CONCAT12(in_stack_fffffffffffff812,
                                                                        in_stack_fffffffffffff810)))
                                            ))),
                  (string *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                  in_stack_fffffffffffff800);
  if (local_40 == post) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8), bVar1)) {
      local_3c = 2;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300d50);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
      if (bVar1) {
        local_3c = 1;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300daa);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
        if ((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8), bVar1))
        {
          local_3c = 0;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          clear((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300e0f);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
          if (bVar1) {
            local_3c = 5;
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            clear((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300e4d);
          }
        }
      }
    }
  }
  std::__cxx11::string::string(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7c0);
  _Var6 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7c0);
  pmVar7 = (message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
            *)_Var6._M_str;
  generateResults(in_stack_0000005c,in_stack_00000050,(string_view)in_stack_00000060,
                  in_stack_00000080,in_stack_00000048);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pmVar7);
  if (local_470 != 0) {
    if (local_470 == 400) {
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pmVar7);
      why_00._M_str = (char *)in_stack_fffffffffffff908;
      why_00._M_len = (size_t)in_stack_fffffffffffff900;
      handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
      ::anon_class_8_1_ba1d73fe::operator()(in_stack_fffffffffffff8f8,why_00);
      HttpSession::send_lambda::operator()(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
      boost::beast::http::
      message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
      ::~message(pmVar7);
      goto LAB_003012ff;
    }
    if (local_470 == 0x194) {
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pmVar7);
      why_01._M_str = (char *)in_stack_fffffffffffff908;
      why_01._M_len = (size_t)in_stack_fffffffffffff900;
      handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
      ::anon_class_8_1_ba1d73fe::operator()(in_stack_fffffffffffff8f8,why_01);
      HttpSession::send_lambda::operator()(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
      boost::beast::http::
      message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
      ::~message(pmVar7);
      goto LAB_003012ff;
    }
  }
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3010d7);
  if (bVar1) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7d0,
               in_stack_fffffffffffff7c8);
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()
              (in_stack_fffffffffffff908,in_stack_fffffffffffff900,in_stack_fffffffffffff910);
    HttpSession::send_lambda::operator()(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
    boost::beast::http::
    message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
    ::~message(pmVar7);
  }
  else {
    pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pmVar7);
    if (*pvVar4 == '{') {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7d0,
                 in_stack_fffffffffffff7c8);
      handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
      ::anon_class_8_1_ba1d73fe::operator()
                (in_stack_fffffffffffff908,in_stack_fffffffffffff900,in_stack_fffffffffffff910);
      HttpSession::send_lambda::operator()(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
      boost::beast::http::
      message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
      ::~message(pmVar7);
    }
    else {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (local_10,in_stack_fffffffffffff7c8);
      handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
      ::anon_class_8_1_ba1d73fe::operator()
                (in_stack_fffffffffffff908,in_stack_fffffffffffff900,in_stack_fffffffffffff910);
      HttpSession::send_lambda::operator()(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
      boost::beast::http::
      message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
      ::~message(pmVar7);
    }
  }
LAB_003012ff:
  CLI::std::
  pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x30130c);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pmVar7);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pmVar7);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pmVar7);
  CLI::std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
  ::~pair((pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
           *)0x301340);
  return;
}

Assistant:

void handle_request(http::request<Body, http::basic_fields<Allocator>>&& req, Send&& send)
{
    static const std::string index_page = generateIndexPage();
    // Returns a bad request response
    auto const bad_request = [&req](std::string_view why) {
        http::response<http::string_body> res{http::status::bad_request, req.version()};
        res.set(http::field::server, "HELICS_WEB_SERVER " HELICS_VERSION_STRING);
        res.set(http::field::content_type, "text/html");
        res.keep_alive(req.keep_alive());

        res.set(http::field::access_control_allow_origin, "*");

        res.body() = std::string(why);
        res.prepare_payload();
        return res;
    };

    // Returns a bad request response
    auto const not_found = [&req](std::string_view why) {
        http::response<http::string_body> res{http::status::not_found, req.version()};
        res.set(http::field::server, "HELICS_WEB_SERVER " HELICS_VERSION_STRING);
        res.set(http::field::content_type, "text/html");
        res.keep_alive(req.keep_alive());

        res.set(http::field::access_control_allow_origin, "*");

        res.body() = std::string(why);
        res.prepare_payload();
        return res;
    };

    // generate a conversion response
    auto const response_ok = [&req](const std::string& resp, std::string_view content_type) {
        http::response<http::string_body> res{http::status::ok, req.version()};
        res.set(http::field::server, "HELICS_WEB_SERVER " HELICS_VERSION_STRING);
        res.set(http::field::content_type, content_type);
        res.keep_alive(req.keep_alive());

        res.set(http::field::access_control_allow_origin, "*");
        res.set(http::field::access_control_allow_methods, "*");
        res.set(http::field::access_control_allow_headers, "*");

        if (req.method() != http::verb::head) {
            res.body() = resp;
            res.prepare_payload();
        } else {
            res.set(http::field::content_length, std::to_string(resp.size()));
        }
        return res;
    };

    RestCommand command{RestCommand::QUERY};

    auto method = req.method();
    switch (method) {
        case http::verb::head:
        case http::verb::search:
        case http::verb::get:
            break;
        case http::verb::post:
        case http::verb::put:
            command = RestCommand::CREATE;
            break;
        case http::verb::delete_:
            command = RestCommand::REMOVE;
            break;
        case http::verb::options:
            return send(response_ok("{\"success\":true}", "application/json"));
        default:
            return send(bad_request("Unknown HTTP-method"));
    }

    const std::string_view target(req.target());
    auto psize = req.payload_size();
    if (target == "/index.html" || target == "index.html" ||
        (target == "/" && (!psize || *psize < 4))) {
        return send(response_ok(index_page, "text/html"));
    }

    if (target == "/healthcheck" || target == "healthcheck") {
        return send(response_ok("{\"success\":true}", "application/json"));
    }

    auto reqpr = processRequestParameters(target, req.body());
    std::string brokerName;
    std::string query;
    std::string targetObj;

    partitionTarget(reqpr.first, brokerName, query, targetObj);

    if (method == http::verb::post) {
        if (brokerName == "delete" || brokerName == "remove") {
            command = RestCommand::REMOVE;
            brokerName.clear();
        } else if (brokerName == "create") {
            command = RestCommand::CREATE;
            brokerName.clear();
        } else if (brokerName == "query" || brokerName == "search") {
            command = RestCommand::QUERY;
            brokerName.clear();
        } else if (brokerName == "command") {
            command = RestCommand::COMMAND;
            brokerName.clear();
        }
    }
    auto res = generateResults(command, brokerName, targetObj, query, reqpr.second);
    switch (res.first) {
        case RequestReturnVal::BAD_REQUEST:
            return send(bad_request(res.second));
        case RequestReturnVal::NOT_FOUND:
            return send(not_found(res.second));
        case RequestReturnVal::OK:
        default:
            if (res.second.empty()) {
                return send(response_ok(index_page, "text/html"));
            }
            if (res.second.front() == '{') {
                return send(response_ok(res.second, "application/json"));
            }
            return send(response_ok(res.second, "text/plain"));
    }
}